

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O1

BN * __thiscall BN::operator+=(BN *this,BN *bn)

{
  pointer puVar1;
  pointer puVar2;
  iterator __position;
  size_t pos;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint local_14;
  
  uVar3 = (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start >> 1;
  uVar5 = (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start >> 1;
  if (uVar5 < uVar3) {
    uVar5 = uVar3;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,uVar5);
  puVar1 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (bn->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar2 - (long)puVar1 >> 1;
  uVar4 = 0;
  if (puVar2 != puVar1) {
    puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      uVar4 = (uint)puVar1[lVar6] + (uint)puVar2[lVar6] + (uVar4 >> 0x10);
      puVar2[lVar6] = (unsigned_short)uVar4;
      lVar6 = lVar6 + 1;
    } while (uVar5 + (uVar5 == 0) != lVar6);
  }
  puVar1 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar3 = (long)__position._M_current - (long)puVar1 >> 1;
  if (uVar5 < uVar3) {
    do {
      uVar4 = (uint)puVar1[uVar5] + (uVar4 >> 0x10);
      puVar1[uVar5] = (unsigned_short)uVar4;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  if (0xffff < uVar4) {
    if (__position._M_current ==
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_realloc_insert<unsigned_int&>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)this,__position,&local_14)
      ;
    }
    else {
      *__position._M_current = (unsigned_short)(uVar4 >> 0x10);
      (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return this;
}

Assistant:

BN& BN::operator += (const BN& bn) {
    ba.resize(max(ba.size(), bn.ba.size()));

    bt2 sum = 0;
    for(size_t pos = 0; pos < bn.ba.size(); pos++) {
        sum = (sum >> bz8) + ba[pos] + bn.ba[pos];
        ba[pos] = sum;
    }

    for(size_t pos = bn.ba.size(); pos < ba.size(); pos++) {
        sum = (sum >> bz8) + ba[pos];
        ba[pos] = sum;
    }
    sum >>= bz8;
    if (sum)
        ba.emplace_back(sum);
    return *this;
}